

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Table
          (Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this
          ,initializer_list<robin_hood::pair<char,_double>_> initlist,size_t param_2,
          hash<char,_void> *h,equal_to<char> *equal)

{
  this->mHashMultiplier = 0xc4ceb9fe1a85ec53;
  this->mKeyVals = (Node *)&this->mMask;
  this->mInfo = (uint8_t *)&this->mMask;
  this->mMaxNumElementsAllowed = 0;
  this->mNumElements = 0;
  this->mMask = 0;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
  insert<robin_hood::pair<char,double>const*>
            ((Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>> *)this,
             initlist._M_array,initlist._M_array + initlist._M_len);
  return;
}

Assistant:

Table(std::initializer_list<value_type> initlist,
          size_t ROBIN_HOOD_UNUSED(bucket_count) /*unused*/ = 0, const Hash& h = Hash{},
          const KeyEqual& equal = KeyEqual{})
        : WHash(h)
        , WKeyEqual(equal) {
        ROBIN_HOOD_TRACE(this)
        insert(initlist.begin(), initlist.end());
    }